

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfuncs.c
# Opt level: O2

char * string_join(char *base,...)

{
  char in_AL;
  size_t sVar1;
  ulong uVar2;
  undefined8 *puVar3;
  size_t sVar4;
  char *__dest;
  undefined8 *puVar5;
  uint uVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  puVar5 = (undefined8 *)&stack0x00000008;
  local_e8[1] = in_RSI;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  sVar1 = strlen(base);
  args[0].gp_offset = 8;
  while( true ) {
    if (args[0].gp_offset < 0x29) {
      uVar2 = (ulong)args[0].gp_offset;
      args[0].gp_offset = args[0].gp_offset + 8;
      puVar3 = (undefined8 *)((long)local_e8 + uVar2);
    }
    else {
      puVar3 = puVar5;
      puVar5 = puVar5 + 1;
    }
    if ((char *)*puVar3 == (char *)0x0) break;
    sVar4 = strlen((char *)*puVar3);
    sVar1 = sVar1 + sVar4;
  }
  __dest = (char *)__ckd_calloc__(sVar1 + 1,1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/strfuncs.c"
                                  ,0x55);
  uVar6 = 8;
  args[0].overflow_arg_area = &stack0x00000008;
  strcpy(__dest,base);
  while( true ) {
    uVar2 = (ulong)uVar6;
    if (uVar2 < 0x29) {
      uVar6 = uVar6 + 8;
      puVar5 = (undefined8 *)((long)local_e8 + uVar2);
    }
    else {
      puVar5 = (undefined8 *)args[0].overflow_arg_area;
      args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
    }
    if ((char *)*puVar5 == (char *)0x0) break;
    strcat(__dest,(char *)*puVar5);
  }
  return __dest;
}

Assistant:

char *
string_join(const char *base, ...)
{
    va_list args;
    size_t len;
    const char *c;
    char *out;

    va_start(args, base);
    len = strlen(base);
    while ((c = va_arg(args, const char *)) != NULL) {
        len += strlen(c);
    }
    len++;
    va_end(args);

    out = ckd_calloc(len, 1);
    va_start(args, base);
    strcpy(out, base);
    while ((c = va_arg(args, const char *)) != NULL) {
        strcat(out, c);
    }
    va_end(args);

    return out;
}